

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsbDec6.c
# Opt level: O1

int Rsb_ManPerformResub6
              (Rsb_Man_t *p,int nVarsAll,word uTruth,Vec_Wrd_t *vDivTruths,word *puTruth0,
              word *puTruth1,int fVerbose)

{
  word *pwVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  word *pGs [200];
  word local_680;
  word *local_678 [201];
  
  iVar4 = vDivTruths->nSize;
  local_680 = uTruth;
  if (199 < (long)iVar4) {
    __assert_fail("nGs < 200",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/rsb/rsbDec6.c"
                  ,699,
                  "int Rsb_ManPerformResub6(Rsb_Man_t *, int, word, Vec_Wrd_t *, word *, word *, int)"
                 );
  }
  if (0 < iVar4) {
    pwVar1 = vDivTruths->pArray;
    lVar8 = 0;
    do {
      *(long *)((long)local_678 + lVar8) = (long)pwVar1 + lVar8;
      lVar8 = lVar8 + 8;
    } while ((long)iVar4 * 8 - lVar8 != 0);
  }
  uVar3 = Rsb_DecPerformInt(p,nVarsAll,&local_680,local_678,iVar4,iVar4,0);
  if (uVar3 == 0) {
    iVar4 = 0;
  }
  else {
    if (fVerbose != 0) {
      Rsb_DecPrintFunc(p,uVar3,&local_680,local_678,iVar4,nVarsAll);
      Rsb_DecPrintTable(p->vCexes->pArray,iVar4,iVar4,p->vTries);
    }
    uVar16 = p->vFanins->nSize;
    if ((int)uVar16 < 0) {
      __assert_fail("nVars >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0x489,"word Abc_Tt6Stretch(word, int)");
    }
    iVar4 = 1;
    uVar5 = 1;
    if (1 < uVar16) {
      uVar5 = uVar16;
    }
    uVar13 = 2;
    if (1 < uVar16) {
      uVar13 = uVar5;
    }
    uVar5 = 3;
    if (uVar13 != 2) {
      uVar5 = uVar13;
    }
    uVar12 = 4;
    if (uVar5 != 3) {
      uVar12 = uVar5;
    }
    uVar11 = 5;
    if (uVar12 != 4) {
      uVar11 = uVar12;
    }
    if (1 < uVar11 - 5) {
      __assert_fail("nVars == 6",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0x496,"word Abc_Tt6Stretch(word, int)");
    }
    uVar15 = uVar3 >> ((byte)(1 << ((byte)uVar16 & 0x1f)) & 0x1f);
    uVar9 = (uVar3 & 1) * 3;
    if (uVar16 != 0) {
      uVar9 = uVar3;
    }
    uVar6 = (uVar15 & 1) * 3;
    if (uVar16 != 0) {
      uVar6 = uVar15;
    }
    uVar7 = (ulong)(uVar9 & 3) * 5;
    if (1 < uVar16) {
      uVar7 = (ulong)uVar3;
    }
    uVar14 = (ulong)(uVar6 & 3) * 5;
    if (1 < uVar16) {
      uVar14 = (ulong)uVar15;
    }
    uVar3 = (uint)uVar7 & 0xf;
    uVar16 = (uint)uVar14 & 0xf;
    uVar10 = (ulong)(uVar16 << 4 | uVar16);
    uVar2 = (ulong)(uVar3 << 4 | uVar3);
    if (uVar13 != 2) {
      uVar10 = uVar14;
      uVar2 = uVar7;
    }
    uVar14 = (ulong)(uint)((int)(uVar10 & 0xff) << 8) | uVar10 & 0xff;
    uVar7 = (ulong)(uint)((int)(uVar2 & 0xff) << 8) | uVar2 & 0xff;
    if (uVar5 != 3) {
      uVar14 = uVar10;
      uVar7 = uVar2;
    }
    uVar10 = (ulong)(uint)((int)uVar14 << 0x10) | uVar14 & 0xffff;
    uVar2 = (ulong)(uint)((int)uVar7 << 0x10) | uVar7 & 0xffff;
    if (uVar12 != 4) {
      uVar10 = uVar14;
      uVar2 = uVar7;
    }
    uVar7 = uVar2 << 0x20 | uVar2;
    if (uVar11 != 5) {
      uVar7 = uVar2;
    }
    *puTruth0 = uVar7;
    uVar7 = uVar10 << 0x20 | uVar10;
    if (uVar11 != 5) {
      uVar7 = uVar10;
    }
    *puTruth1 = uVar7;
  }
  return iVar4;
}

Assistant:

int Rsb_ManPerformResub6( Rsb_Man_t * p, int nVarsAll, word uTruth, Vec_Wrd_t * vDivTruths, word * puTruth0, word * puTruth1, int fVerbose )
{
    word * pGs[200];
    unsigned uTruthRes;
    int i, nVars, nGs = Vec_WrdSize(vDivTruths);
    assert( nGs < 200 );
    for ( i = 0; i < nGs; i++ )
        pGs[i] = Vec_WrdEntryP(vDivTruths,i);
    uTruthRes = Rsb_DecPerformInt( p, nVarsAll, &uTruth, pGs, nGs, nGs, 0 );
    if ( uTruthRes == 0 )
        return 0;

    if ( fVerbose )
        Rsb_DecPrintFunc( p, uTruthRes, &uTruth, pGs, nGs, nVarsAll );
    if ( fVerbose )
        Rsb_DecPrintTable( Vec_WrdArray(p->vCexes), nGs, nGs, p->vTries );

    nVars = Vec_IntSize(p->vFanins);
    *puTruth0 = Abc_Tt6Stretch( uTruthRes,                 nVars );
    *puTruth1 = Abc_Tt6Stretch( uTruthRes >> (1 << nVars), nVars );
    return 1;
}